

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

void f_parser(lua_State *L,void *ud)

{
  undefined8 *puVar1;
  lua_State *L_00;
  Closure *pCVar2;
  UpVal *pUVar3;
  lua_State *in_RSI;
  long in_RDI;
  TValue *i_o;
  SParser *p;
  Closure *cl;
  Proto *tf;
  int i;
  char *in_stack_00000298;
  Mbuffer *in_stack_000002a0;
  ZIO *in_stack_000002a8;
  lua_State *in_stack_000002b0;
  undefined8 in_stack_ffffffffffffffd8;
  int nelems;
  int local_14;
  
  nelems = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  if (*(ulong *)(*(long *)(in_RDI + 0x20) + 0x70) <= *(ulong *)(*(long *)(in_RDI + 0x20) + 0x78)) {
    luaC_step(in_RSI);
  }
  L_00 = (lua_State *)
         luaY_parser(in_stack_000002b0,in_stack_000002a8,in_stack_000002a0,in_stack_00000298);
  pCVar2 = luaF_newLclosure(L_00,nelems,(Table *)in_RSI);
  (pCVar2->l).p = (Proto *)L_00;
  for (local_14 = 0; local_14 < (int)(uint)*(byte *)&L_00->hook; local_14 = local_14 + 1) {
    pUVar3 = luaF_newupval(in_RSI);
    *(UpVal **)((long)pCVar2 + (long)local_14 * 8 + 0x28) = pUVar3;
  }
  puVar1 = *(undefined8 **)(in_RDI + 0x10);
  *puVar1 = pCVar2;
  *(undefined4 *)(puVar1 + 1) = 6;
  if (*(long *)(in_RDI + 0x38) - *(long *)(in_RDI + 0x10) < 0x11) {
    luaD_growstack(in_RSI,(int)((ulong)puVar1 >> 0x20));
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) + 0x10;
  return;
}

Assistant:

static void f_parser(lua_State*L,void*ud){
int i;
Proto*tf;
Closure*cl;
struct SParser*p=cast(struct SParser*,ud);
luaC_checkGC(L);
tf=luaY_parser(L,p->z,
&p->buff,p->name);
cl=luaF_newLclosure(L,tf->nups,hvalue(gt(L)));
cl->l.p=tf;
for(i=0;i<tf->nups;i++)
cl->l.upvals[i]=luaF_newupval(L);
setclvalue(L,L->top,cl);
incr_top(L);
}